

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O3

bool __thiscall Game::put(Game *this,int x,int y,int freeput)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  pair<int,_int> pVar4;
  ulong uVar5;
  
  bVar2 = Boards::freeput(this->board,x,y,this->turn);
  if (bVar2) {
    iVar1 = this->turn;
    this->turn = -iVar1;
    this->howturn = this->howturn + 1;
    bVar3 = Boards::isFull(this->board,-iVar1);
    this->full = bVar3;
    pVar4 = Boards::Count(this->board);
    uVar5 = (ulong)pVar4 >> 0x20 | (long)pVar4 << 0x20;
    this->b = (int)uVar5;
    this->w = (int)(uVar5 >> 0x20);
    canPass(this);
    if ((this->w == 0) || (this->b == 0)) {
      this->full = true;
    }
  }
  return bVar2;
}

Assistant:

bool Game::put(int x, int y, int freeput){
	int temp1 = x, temp2 = y;
	if(board->freeput(temp1, temp2, turn)){
		turn *= -1;
		howturn++;
		full = board->isFull(turn);
		std::pair<int, int> koma(board->Count());
		w = koma.first;
		b = koma.second;
		canPass();
		if(w == 0 || b == 0)full = true;
		return true;
	}
	return false;
}